

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_GlaDumpAbsracted(Ga2_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pInit;
  Gia_Man_t *pAbs;
  Vec_Int_t *vGateClasses;
  char *pFileName;
  Ga2_Man_t *pGStack_10;
  int fVerbose_local;
  Ga2_Man_t *p_local;
  
  pFileName._4_4_ = fVerbose;
  pGStack_10 = p;
  if ((p->pPars->fDumpMabs == 0) && (p->pPars->fDumpVabs == 0)) {
    __assert_fail("p->pPars->fDumpMabs || p->pPars->fDumpVabs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                  ,0x590,"void Ga2_GlaDumpAbsracted(Ga2_Man_t *, int)");
  }
  if (p->pPars->fDumpMabs == 0) {
    if (p->pPars->fDumpVabs == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absGla.c"
                    ,0x5aa,"void Ga2_GlaDumpAbsracted(Ga2_Man_t *, int)");
    }
    vGateClasses = (Vec_Int_t *)Ga2_GlaGetFileName(p,1);
    if (pFileName._4_4_ != 0) {
      Abc_Print(1,"Dumping abstracted model into file \"%s\"...\n",vGateClasses);
    }
    pAbs = (Gia_Man_t *)Ga2_ManAbsTranslate(pGStack_10);
    pInit = Gia_ManDupAbsGates(pGStack_10->pGia,(Vec_Int_t *)pAbs);
    Gia_ManCleanValue(pGStack_10->pGia);
    Gia_AigerWrite(pInit,(char *)vGateClasses,0,0,0);
    Gia_ManStop(pInit);
    Vec_IntFreeP((Vec_Int_t **)&pAbs);
  }
  else {
    vGateClasses = (Vec_Int_t *)Ga2_GlaGetFileName(p,0);
    if (pFileName._4_4_ != 0) {
      Abc_Print(1,"Dumping miter with abstraction map into file \"%s\"...\n",vGateClasses);
    }
    Vec_IntFreeP(&pGStack_10->pGia->vGateClasses);
    pVVar1 = Ga2_ManAbsTranslate(pGStack_10);
    pGStack_10->pGia->vGateClasses = pVVar1;
    Gia_AigerWrite(pGStack_10->pGia,(char *)vGateClasses,0,0,0);
  }
  return;
}

Assistant:

void Ga2_GlaDumpAbsracted( Ga2_Man_t * p, int fVerbose )
{
    char * pFileName;
    assert( p->pPars->fDumpMabs || p->pPars->fDumpVabs );
    if ( p->pPars->fDumpMabs )
    {
        pFileName = Ga2_GlaGetFileName(p, 0);
        if ( fVerbose )
            Abc_Print( 1, "Dumping miter with abstraction map into file \"%s\"...\n", pFileName );
        // dump abstraction map
        Vec_IntFreeP( &p->pGia->vGateClasses );
        p->pGia->vGateClasses = Ga2_ManAbsTranslate( p );
        Gia_AigerWrite( p->pGia, pFileName, 0, 0, 0 );
    }
    else if ( p->pPars->fDumpVabs )
    {
        Vec_Int_t * vGateClasses;
        Gia_Man_t * pAbs;
        pFileName = Ga2_GlaGetFileName(p, 1);
        if ( fVerbose )
            Abc_Print( 1, "Dumping abstracted model into file \"%s\"...\n", pFileName );
        // dump absracted model
        vGateClasses = Ga2_ManAbsTranslate( p );
        pAbs = Gia_ManDupAbsGates( p->pGia, vGateClasses );
        Gia_ManCleanValue( p->pGia );
        Gia_AigerWrite( pAbs, pFileName, 0, 0, 0 );
        Gia_ManStop( pAbs );
        Vec_IntFreeP( &vGateClasses );
    }
    else assert( 0 );
}